

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

int sys_trim(mstate m,size_t pad)

{
  size_t *psVar1;
  mchunkptr pmVar2;
  int iVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  msegmentptr sp_1;
  mstate pmVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  mstate m_00;
  ulong uVar13;
  msegmentptr sp;
  malloc_segment *pmVar14;
  bool bVar15;
  bool bVar16;
  
  m_00 = m;
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar3 = malloc_global_mutex;
  if ((mstate)0xffffffffffffff7f < m) {
    return 0;
  }
  if (_gm_.top == (mchunkptr)0x0) {
    return 0;
  }
  if (_gm_.topsize <= m->smallbins + 1) {
    uVar12 = 0;
    goto LAB_001077c4;
  }
  uVar11 = ((((_gm_.topsize - (long)m) + mparams.granularity) - 0x51) / mparams.granularity - 1) *
           mparams.granularity;
  pmVar14 = &_gm_.seg;
  do {
    if (((mchunkptr)pmVar14->base <= _gm_.top) &&
       (_gm_.top < (mchunkptr)((long)&((mchunkptr)pmVar14->base)->prev_foot + pmVar14->size)))
    goto LAB_00107696;
    pmVar14 = pmVar14->next;
  } while (pmVar14 != (malloc_segment *)0x0);
  pmVar14 = (malloc_segment *)0x0;
LAB_00107696:
  if ((pmVar14->sflags & 8) == 0) {
    if ((pmVar14->sflags & 1) != 0) {
      uVar13 = pmVar14->size;
      if (uVar11 <= uVar13) {
        m_00 = (mstate)pmVar14->base;
        pmVar9 = (mstate)&_gm_.seg;
        do {
          bVar15 = m_00 <= pmVar9;
          bVar16 = pmVar9 < (mstate)((long)m_00->smallbins + (uVar13 - 0x48));
          uVar12 = 0;
          if (bVar16 && bVar15) goto LAB_00107761;
          pmVar9 = (mstate)pmVar9->topsize;
        } while (pmVar9 != (mstate)0x0);
        if (!bVar16 || !bVar15) {
          m_00 = (mstate)((long)m_00 + (uVar13 - uVar11));
          iVar3 = munmap(m_00,uVar11);
          uVar12 = 0;
          if (iVar3 == 0) {
            uVar12 = uVar11;
          }
          goto LAB_00107761;
        }
      }
      goto LAB_0010770f;
    }
    uVar13 = 0x8000000000000000 - mparams.granularity;
    if (uVar11 < 0x7fffffffffffffff) {
      uVar13 = uVar11;
    }
    uVar10 = 1;
    LOCK();
    malloc_global_mutex = 1;
    UNLOCK();
    if (iVar3 != 0) {
      while (malloc_global_mutex != 0) {
        if ((uVar10 & 0x3f) == 0) {
          sched_yield();
        }
        uVar10 = uVar10 + 1;
      }
      LOCK();
      UNLOCK();
    }
    malloc_global_mutex = 1;
    m_00 = (mstate)0x0;
    pcVar4 = (char *)sbrk(0);
    uVar12 = 0;
    if (pcVar4 == pmVar14->base + pmVar14->size) {
      pvVar5 = sbrk(-uVar13);
      m_00 = (mstate)0x0;
      pcVar6 = (char *)sbrk(0);
      uVar12 = (long)pcVar4 - (long)pcVar6;
      if (pcVar4 < pcVar6 || (long)pcVar4 - (long)pcVar6 == 0) {
        uVar12 = 0;
      }
      if (pvVar5 == (void *)0xffffffffffffffff) {
        uVar12 = 0;
      }
    }
    malloc_global_mutex = 0;
  }
  else {
LAB_0010770f:
    uVar12 = 0;
  }
LAB_00107761:
  if (uVar12 != 0) {
    pmVar14->size = pmVar14->size - uVar12;
    pmVar2 = _gm_.top;
    _gm_.footprint = _gm_.footprint - uVar12;
    lVar8 = _gm_.topsize - uVar12;
    uVar11 = (ulong)(-(int)_gm_.top - 0x10U & 0xf);
    _gm_.topsize = lVar8 - uVar11;
    m_00 = (mstate)(_gm_.topsize | 1);
    psVar1 = &(_gm_.top)->head;
    _gm_.top = (mchunkptr)((long)&(_gm_.top)->prev_foot + uVar11);
    *(mstate *)((long)psVar1 + uVar11) = m_00;
    *(undefined8 *)((long)pmVar2 + lVar8 + 8) = 0x50;
    _gm_.trim_check = mparams.trim_threshold;
  }
LAB_001077c4:
  sVar7 = release_unused_segments(m_00);
  iVar3 = 1;
  if ((sVar7 + uVar12 == 0) && (iVar3 = 0, _gm_.trim_check < _gm_.topsize)) {
    _gm_.trim_check = 0xffffffffffffffff;
  }
  return iVar3;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}